

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  int *piVar1;
  ImGuiInputEvent *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  long lVar5;
  ImGuiInputEvent *__dest;
  int iVar6;
  float *pfVar7;
  ulong uVar8;
  ImGuiInputEventMousePos *pIVar9;
  int iVar10;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  if (this->AppAcceptingEvents == true) {
    if (-3.4028235e+38 < x) {
      x = (float)(int)((int)x - (uint)((float)(int)x != x && x < 0.0));
    }
    if (-3.4028235e+38 < y) {
      y = (float)(int)((int)y - (uint)((float)(int)y != y && y < 0.0));
    }
    iVar4 = (GImGui->InputEventsQueue).Size;
    lVar5 = (long)iVar4;
    if (0 < lVar5) {
      uVar8 = lVar5 + 1;
      pfVar7 = &(GImGui->InputEventsQueue).Data[lVar5 + -1].field_2.MousePos.PosY;
      do {
        if (pfVar7[-3] == 1.4013e-45) {
          pIVar9 = (ImGuiInputEventMousePos *)(pfVar7 + -1);
          goto LAB_001d7d50;
        }
        uVar8 = uVar8 - 1;
        pfVar7 = pfVar7 + -6;
      } while (1 < uVar8);
    }
    pIVar9 = (ImGuiInputEventMousePos *)&(GImGui->IO).MousePos;
    pfVar7 = &(GImGui->IO).MousePos.y;
LAB_001d7d50:
    if ((pIVar9->PosX == x) && (!NAN(pIVar9->PosX) && !NAN(x))) {
      if ((*pfVar7 == y) && (!NAN(*pfVar7) && !NAN(y))) {
        return;
      }
    }
    if (iVar4 == (GImGui->InputEventsQueue).Capacity) {
      if (iVar4 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar4 / 2 + iVar4;
      }
      iVar10 = iVar4 + 1;
      if (iVar4 + 1 < iVar6) {
        iVar10 = iVar6;
      }
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar10 * 0x18,GImAllocatorUserData)
      ;
      pIVar2 = (pIVar3->InputEventsQueue).Data;
      if (pIVar2 != (ImGuiInputEvent *)0x0) {
        memcpy(__dest,pIVar2,(long)(pIVar3->InputEventsQueue).Size * 0x18);
        pIVar2 = (pIVar3->InputEventsQueue).Data;
        if ((pIVar2 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      (pIVar3->InputEventsQueue).Data = __dest;
      (pIVar3->InputEventsQueue).Capacity = iVar10;
      iVar4 = (pIVar3->InputEventsQueue).Size;
    }
    else {
      __dest = (GImGui->InputEventsQueue).Data;
    }
    __dest[iVar4].Type = ImGuiInputEventType_MousePos;
    __dest[iVar4].Source = ImGuiInputSource_Mouse;
    __dest[iVar4].field_2.MousePos.PosX = x;
    __dest[iVar4].field_2.MousePos.PosY = y;
    *(undefined8 *)((long)&__dest[iVar4].field_2 + 8) = 0;
    (pIVar3->InputEventsQueue).Size = (pIVar3->InputEventsQueue).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (!AppAcceptingEvents)
        return;

    // Apply same flooring as UpdateMouseInputs()
    ImVec2 pos((x > -FLT_MAX) ? ImFloorSigned(x) : x, (y > -FLT_MAX) ? ImFloorSigned(y) : y);

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MousePos);
    const ImVec2 latest_pos = latest_event ? ImVec2(latest_event->MousePos.PosX, latest_event->MousePos.PosY) : g.IO.MousePos;
    if (latest_pos.x == pos.x && latest_pos.y == pos.y)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = pos.x;
    e.MousePos.PosY = pos.y;
    g.InputEventsQueue.push_back(e);
}